

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O1

char * nifti_findhdrname(char *fname)

{
  int iVar1;
  char *__s;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  size_t maxlen;
  long lVar5;
  bool bVar6;
  char extzip [4];
  char elist [2] [5];
  char local_3c [20];
  
  builtin_strncpy(local_3c + 4,".hdr",5);
  builtin_strncpy(local_3c + 9,".nii",5);
  builtin_strncpy(local_3c,".gz",4);
  iVar1 = nifti_validfilename(fname);
  if ((iVar1 == 0) || (__s = nifti_makebasename(fname), __s == (char *)0x0)) {
    return (char *)0x0;
  }
  pcVar2 = nifti_find_file_extension(fname);
  if (pcVar2 == (char *)0x0) {
    bVar6 = true;
  }
  else {
    iVar1 = is_uppercase(pcVar2);
    bVar6 = iVar1 == 0;
  }
  lVar5 = 1;
  if ((pcVar2 != (char *)0x0) && (iVar1 = nifti_fileexists(fname), iVar1 != 0)) {
    iVar1 = fileext_n_compare(pcVar2,".img",maxlen);
    if (iVar1 != 0) {
      pcVar3 = nifti_strdup(fname);
      goto LAB_0010da0a;
    }
    lVar5 = 0;
  }
  if (!bVar6) {
    make_uppercase(local_3c + 4);
    make_uppercase(local_3c + 9);
    make_uppercase(local_3c);
  }
  sVar4 = strlen(__s);
  pcVar2 = (char *)calloc(1,sVar4 + 8);
  if (pcVar2 == (char *)0x0) {
    nifti_findhdrname_cold_1();
    pcVar2 = __s;
  }
  else {
    strcpy(pcVar2,__s);
    strcat(pcVar2,local_3c + lVar5 * 5 + 4);
    iVar1 = nifti_fileexists(pcVar2);
    pcVar3 = pcVar2;
    if (iVar1 != 0) goto LAB_0010da0a;
    strcat(pcVar2,local_3c);
    iVar1 = nifti_fileexists(pcVar2);
    if (iVar1 != 0) goto LAB_0010da0a;
    strcpy(pcVar2,__s);
    strcat(pcVar2,local_3c + (ulong)((uint)lVar5 ^ 1) * 5 + 4);
    iVar1 = nifti_fileexists(pcVar2);
    if (iVar1 != 0) goto LAB_0010da0a;
    strcat(pcVar2,local_3c);
    iVar1 = nifti_fileexists(pcVar2);
    free(__s);
    if (iVar1 != 0) {
      return pcVar2;
    }
  }
  pcVar3 = (char *)0x0;
  __s = pcVar2;
LAB_0010da0a:
  free(__s);
  return pcVar3;
}

Assistant:

char * nifti_findhdrname(const char* fname)
{
   char *basename, *hdrname;
   const char *ext;
   char  elist[2][5] = { ".hdr", ".nii" };
   char  extzip[4]   = ".gz";
   int   efirst = 1;    /* init to .nii extension */
   int   eisupper = 0;  /* init to lowercase extensions */

   /**- check input file(s) for sanity */
   if( !nifti_validfilename(fname) ) return NULL;

   basename = nifti_makebasename(fname);
   if( !basename ) return NULL;   /* only on string alloc failure */

   /**- return filename if it has a valid extension and exists
         (except if it is an .img file (and maybe .gz)) */
   ext = nifti_find_file_extension(fname);

   if( ext ) eisupper = is_uppercase(ext);  /* do we look for uppercase? */

   /* if the file exists and is a valid header name (not .img), return it */
   if ( ext && nifti_fileexists(fname) ) {
     /* allow for uppercase extension */
     if ( fileext_n_compare(ext,".img",4) != 0 ){
        hdrname = nifti_strdup(fname);
        free(basename);
        return hdrname;
     } else
        efirst = 0;     /* note for below */
   }

   /* So the requested name is a basename, contains .img, or does not exist. */
   /* In any case, use basename. */

   /**- if .img, look for .hdr, .hdr.gz, .nii, .nii.gz, in that order */
   /**- else,    look for .nii, .nii.gz, .hdr, .hdr.gz, in that order */

   /* if we get more extension choices, this could be a loop */

   /* note: efirst is 0 in the case of ".img" */

   /* if the user passed an uppercase entension (.IMG), search for uppercase */
   if( eisupper ) {
      make_uppercase(elist[0]);
      make_uppercase(elist[1]);
      make_uppercase(extzip);
   }

   hdrname = (char *)calloc(sizeof(char),strlen(basename)+8);
   if( !hdrname ){
      fprintf(stderr,"** nifti_findhdrname: failed to alloc hdrname\n");
      free(basename);
      return NULL;
   }

   strcpy(hdrname,basename);
   strcat(hdrname,elist[efirst]);
   if (nifti_fileexists(hdrname)) { free(basename); return hdrname; }
#ifdef HAVE_ZLIB
   strcat(hdrname,extzip);
   if (nifti_fileexists(hdrname)) { free(basename); return hdrname; }
#endif

   /* okay, try the other possibility */

   efirst = 1 - efirst;

   strcpy(hdrname,basename);
   strcat(hdrname,elist[efirst]);
   if (nifti_fileexists(hdrname)) { free(basename); return hdrname; }
#ifdef HAVE_ZLIB
   strcat(hdrname,extzip);
   if (nifti_fileexists(hdrname)) { free(basename); return hdrname; }
#endif

   /**- if nothing has been found, return NULL */
   free(basename);
   free(hdrname);
   return NULL;
}